

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void handle_simd_3same_pair
               (DisasContext_conflict1 *s,int is_q,int u,int opcode,int size,int rn,int rm,int rd)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  byte bVar2;
  uint uVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 tcg_dest;
  TCGv_i64 retval;
  TCGv_i32 pTVar5;
  TCGv_i32 tcg_dest_00;
  TCGv_i32 retval_00;
  NeonGenTwoOpFn **ppNVar6;
  ulong uVar7;
  int iVar8;
  uintptr_t o;
  long lVar9;
  TCGv_ptr local_b8;
  TCGv_i64 tcg_res [2];
  
  tcg_ctx = s->uc->tcg_ctx;
  if (opcode < 0x58) {
    local_b8 = (TCGv_ptr)0x0;
  }
  else {
    local_b8 = get_fpstatus_ptr_aarch64(tcg_ctx,false);
  }
  _Var1 = fp_access_check(s);
  if (_Var1) {
    if (size == 3) {
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        pTVar4 = tcg_temp_new_i64(tcg_ctx);
        tcg_dest = tcg_temp_new_i64(tcg_ctx);
        iVar8 = rm;
        if (lVar9 == 0) {
          iVar8 = rn;
        }
        read_vec_element(s,pTVar4,iVar8,0,MO_64);
        read_vec_element(s,tcg_dest,iVar8,1,MO_64);
        retval = tcg_temp_new_i64(tcg_ctx);
        tcg_res[lVar9] = retval;
        if (opcode == 0x7e) {
          gen_helper_vfp_mind(tcg_ctx,retval,pTVar4,tcg_dest,local_b8);
        }
        else if (opcode == 0x58) {
          gen_helper_vfp_maxnumd(tcg_ctx,retval,pTVar4,tcg_dest,local_b8);
        }
        else if (opcode == 0x5a) {
          gen_helper_vfp_addd(tcg_ctx,retval,pTVar4,tcg_dest,local_b8);
        }
        else if (opcode == 0x5e) {
          gen_helper_vfp_maxd(tcg_ctx,retval,pTVar4,tcg_dest,local_b8);
        }
        else if (opcode == 0x78) {
          gen_helper_vfp_minnumd(tcg_ctx,retval,pTVar4,tcg_dest,local_b8);
        }
        else {
          if (opcode != 0x17) {
            iVar8 = 0x2bfd;
LAB_0063ce14:
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                       ,iVar8,(char *)0x0);
          }
          tcg_gen_add_i64(tcg_ctx,retval,pTVar4,tcg_dest);
        }
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
      }
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        pTVar4 = tcg_res[lVar9];
        write_vec_element(s,pTVar4,rd,(int)lVar9,MO_64);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      }
    }
    else {
      uVar3 = (uint)(is_q != 0) * 2 + 2;
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        pTVar5 = tcg_temp_new_i32(tcg_ctx);
        tcg_dest_00 = tcg_temp_new_i32(tcg_ctx);
        iVar8 = rm;
        if (uVar7 < uVar3 >> 1) {
          iVar8 = rn;
        }
        bVar2 = (byte)uVar7 & is_q != 0;
        read_vec_element_i32(s,pTVar5,iVar8,(uint)bVar2 * 2,MO_32);
        read_vec_element_i32(s,tcg_dest_00,iVar8,(uint)bVar2 * 2 + 1,MO_32);
        retval_00 = tcg_temp_new_i32(tcg_ctx);
        tcg_res[uVar7] = (TCGv_i64)retval_00;
        if (opcode == 0x7e) {
          gen_helper_vfp_mins(tcg_ctx,retval_00,pTVar5,tcg_dest_00,local_b8);
        }
        else {
          ppNVar6 = handle_simd_3same_pair::fns_2[(uint)size] + (uint)u;
          if ((opcode == 0x15) ||
             (ppNVar6 = handle_simd_3same_pair::fns + (uint)size, opcode == 0x17)) {
LAB_0063cc73:
            if (*ppNVar6 != (NeonGenTwoOpFn *)0x0) {
              (**ppNVar6)(tcg_ctx,retval_00,pTVar5,tcg_dest_00);
            }
          }
          else if (opcode == 0x58) {
            gen_helper_vfp_maxnums(tcg_ctx,retval_00,pTVar5,tcg_dest_00,local_b8);
          }
          else if (opcode == 0x5a) {
            gen_helper_vfp_adds(tcg_ctx,retval_00,pTVar5,tcg_dest_00,local_b8);
          }
          else if (opcode == 0x5e) {
            gen_helper_vfp_maxs(tcg_ctx,retval_00,pTVar5,tcg_dest_00,local_b8);
          }
          else {
            if (opcode != 0x78) {
              ppNVar6 = handle_simd_3same_pair::fns_1[(uint)size] + (uint)u;
              if (opcode == 0x14) goto LAB_0063cc73;
              iVar8 = 0x2c47;
              goto LAB_0063ce14;
            }
            gen_helper_vfp_minnums(tcg_ctx,retval_00,pTVar5,tcg_dest_00,local_b8);
          }
        }
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest_00 + (long)tcg_ctx));
      }
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        pTVar5 = (TCGv_i32)tcg_res[uVar7];
        write_vec_element_i32(s,pTVar5,rd,(int)uVar7,MO_32);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
      }
      clear_vec_high(s,is_q != 0,rd);
    }
    if (local_b8 != (TCGv_ptr)0x0) {
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_b8 + (long)tcg_ctx));
      return;
    }
  }
  return;
}

Assistant:

static void handle_simd_3same_pair(DisasContext *s, int is_q, int u, int opcode,
                                   int size, int rn, int rm, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    int pass;

    /* Floating point operations need fpst */
    if (opcode >= 0x58) {
        fpst = get_fpstatus_ptr(tcg_ctx, false);
    } else {
        fpst = NULL;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* These operations work on the concatenated rm:rn, with each pair of
     * adjacent elements being operated on to produce an element in the result.
     */
    if (size == 3) {
        TCGv_i64 tcg_res[2];

        for (pass = 0; pass < 2; pass++) {
            TCGv_i64 tcg_op1 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 tcg_op2 = tcg_temp_new_i64(tcg_ctx);
            int passreg = (pass == 0) ? rn : rm;

            read_vec_element(s, tcg_op1, passreg, 0, MO_64);
            read_vec_element(s, tcg_op2, passreg, 1, MO_64);
            tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

            switch (opcode) {
            case 0x17: /* ADDP */
                tcg_gen_add_i64(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
                break;
            case 0x58: /* FMAXNMP */
                gen_helper_vfp_maxnumd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5a: /* FADDP */
                gen_helper_vfp_addd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5e: /* FMAXP */
                gen_helper_vfp_maxd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x78: /* FMINNMP */
                gen_helper_vfp_minnumd(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x7e: /* FMINP */
                gen_helper_vfp_mind(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            tcg_temp_free_i64(tcg_ctx, tcg_op1);
            tcg_temp_free_i64(tcg_ctx, tcg_op2);
        }

        for (pass = 0; pass < 2; pass++) {
            write_vec_element(s, tcg_res[pass], rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_res[pass]);
        }
    } else {
        int maxpass = is_q ? 4 : 2;
        TCGv_i32 tcg_res[4];

        for (pass = 0; pass < maxpass; pass++) {
            TCGv_i32 tcg_op1 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_op2 = tcg_temp_new_i32(tcg_ctx);
            NeonGenTwoOpFn *genfn = NULL;
            int passreg = pass < (maxpass / 2) ? rn : rm;
            int passelt = (is_q && (pass & 1)) ? 2 : 0;

            read_vec_element_i32(s, tcg_op1, passreg, passelt, MO_32);
            read_vec_element_i32(s, tcg_op2, passreg, passelt + 1, MO_32);
            tcg_res[pass] = tcg_temp_new_i32(tcg_ctx);

            switch (opcode) {
            case 0x17: /* ADDP */
            {
                static NeonGenTwoOpFn * const fns[3] = {
                    gen_helper_neon_padd_u8,
                    gen_helper_neon_padd_u16,
                    tcg_gen_add_i32,
                };
                genfn = fns[size];
                break;
            }
            case 0x14: /* SMAXP, UMAXP */
            {
                static NeonGenTwoOpFn * const fns[3][2] = {
                    { gen_helper_neon_pmax_s8, gen_helper_neon_pmax_u8 },
                    { gen_helper_neon_pmax_s16, gen_helper_neon_pmax_u16 },
                    { tcg_gen_smax_i32, tcg_gen_umax_i32 },
                };
                genfn = fns[size][u];
                break;
            }
            case 0x15: /* SMINP, UMINP */
            {
                static NeonGenTwoOpFn * const fns[3][2] = {
                    { gen_helper_neon_pmin_s8, gen_helper_neon_pmin_u8 },
                    { gen_helper_neon_pmin_s16, gen_helper_neon_pmin_u16 },
                    { tcg_gen_smin_i32, tcg_gen_umin_i32 },
                };
                genfn = fns[size][u];
                break;
            }
            /* The FP operations are all on single floats (32 bit) */
            case 0x58: /* FMAXNMP */
                gen_helper_vfp_maxnums(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5a: /* FADDP */
                gen_helper_vfp_adds(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x5e: /* FMAXP */
                gen_helper_vfp_maxs(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x78: /* FMINNMP */
                gen_helper_vfp_minnums(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            case 0x7e: /* FMINP */
                gen_helper_vfp_mins(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            /* FP ops called directly, otherwise call now */
            if (genfn) {
                genfn(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op1);
            tcg_temp_free_i32(tcg_ctx, tcg_op2);
        }

        for (pass = 0; pass < maxpass; pass++) {
            write_vec_element_i32(s, tcg_res[pass], rd, pass, MO_32);
            tcg_temp_free_i32(tcg_ctx, tcg_res[pass]);
        }
        clear_vec_high(s, is_q, rd);
    }

    if (fpst) {
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }
}